

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_70::crashHandler(anon_unknown_70 *this,int signo,siginfo_t *info,void *context)

{
  char *__n;
  char *pcVar1;
  void *__buf;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> AVar2;
  char *pcVar3;
  undefined1 local_18d;
  int signo_local;
  String local_188;
  String local_168;
  String message;
  char *local_130;
  void *traceSpace [32];
  
  signo_local = (int)this;
  memset((kj *)traceSpace,0,0x100);
  space.size_ = 2;
  space.ptr = (void **)&DAT_00000020;
  AVar2 = getStackTrace((kj *)traceSpace,space,(uint)context);
  local_130 = strsignal(signo_local);
  message.content._0_16_ = AVar2;
  strArray<kj::ArrayPtr<void*const>&>
            (&local_188,(kj *)&message,(ArrayPtr<void_*const> *)0x1f5311,(char *)context);
  pcVar3 = (char *)0x1b6abc;
  stringifyStackTrace((ArrayPtr<void_*const>)traceSpace._8_16_);
  local_18d = 10;
  __n = ": ";
  str<char_const(&)[22],int&,char_const(&)[3],char*,char_const(&)[9],kj::String,kj::String,char>
            (&message,(kj *)"*** Received signal #",(char (*) [22])&signo_local,(int *)0x1ea1ca,
             (char (*) [3])&local_130,(char **)0x1f6b92,(char (*) [9])&local_188,&local_168,
             (String *)&local_18d,pcVar3);
  pcVar1 = (char *)local_168.content.size_;
  pcVar3 = local_168.content.ptr;
  if (local_168.content.ptr != (char *)0x0) {
    local_168.content.ptr = (char *)0x0;
    local_168.content.size_ = 0;
    (**(local_168.content.disposer)->_vptr_ArrayDisposer)
              (local_168.content.disposer,pcVar3,1,pcVar1,pcVar1,0);
    __n = pcVar1;
  }
  pcVar1 = (char *)local_188.content.size_;
  pcVar3 = local_188.content.ptr;
  if ((_func_int **)local_188.content.ptr != (_func_int **)0x0) {
    local_188.content.ptr = (char *)0x0;
    local_188.content.size_ = 0;
    (**(local_188.content.disposer)->_vptr_ArrayDisposer)
              (local_188.content.disposer,pcVar3,1,pcVar1,pcVar1,0);
    __n = pcVar1;
  }
  local_188.content.ptr = (char *)&PTR__FdOutputStream_00239730;
  local_188.content.size_ = 0xffffffff00000002;
  pcVar3 = (char *)message.content.size_;
  if (message.content.size_ != 0) {
    pcVar3 = message.content.ptr;
  }
  __buf = (void *)0x0;
  if (message.content.size_ != 0) {
    __buf = (void *)(message.content.size_ - 1);
  }
  FdOutputStream::write((FdOutputStream *)&local_188,(int)pcVar3,__buf,(size_t)__n);
  FdOutputStream::~FdOutputStream((FdOutputStream *)&local_188);
  _exit(1);
}

Assistant:

[[noreturn]] void crashHandler(int signo, siginfo_t* info, void* context) {
  void* traceSpace[32]{};

#if KJ_USE_WIN32_DBGHELP
  // Win32 backtracing can't trace its way out of a Cygwin signal handler. However, Cygwin gives
  // us direct access to the CONTEXT, which we can pass to the Win32 tracing functions.
  ucontext_t* ucontext = reinterpret_cast<ucontext_t*>(context);
  // Cygwin's mcontext_t has the same layout as CONTEXT.
  // TODO(someday): Figure out why this produces garbage for SIGINT from ctrl+C. It seems to work
  //   correctly for SIGSEGV.
  CONTEXT win32Context;
  static_assert(sizeof(ucontext->uc_mcontext) >= sizeof(win32Context),
      "mcontext_t should be an extension of CONTEXT");
  memcpy(&win32Context, &ucontext->uc_mcontext, sizeof(win32Context));
  auto trace = getStackTrace(traceSpace, 0, GetCurrentThread(), win32Context);
#else
  // ignoreCount = 2 to ignore crashHandler() and signal trampoline.
  auto trace = getStackTrace(traceSpace, 2);
#endif

  auto message = kj::str("*** Received signal #", signo, ": ", strsignal(signo),
                         "\nstack: ", stringifyStackTraceAddresses(trace),
                         stringifyStackTrace(trace), '\n');

  FdOutputStream(STDERR_FILENO).write(message.asBytes());
  _exit(1);
}